

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Field::Field(Field *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Field_003e3768;
  (this->options_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->options_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->options_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->options_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  SharedCtor(this);
  return;
}

Assistant:

Field::Field(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena),
  options_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.Field)
}